

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_ffi_xof(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  CTypeID id_00;
  TRef TVar2;
  CType *pCVar3;
  CType *ct;
  CTypeID id;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  id_00 = argv2ctype(J,*J->base,rd->argv);
  if (rd->data == 0xd4) {
    pCVar3 = lj_ctype_rawref((CTState *)J[-1].penalty[0x3b].pc.ptr64,id_00);
    if ((pCVar3->info & 0xd0100000) == 0x10100000) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
  }
  else if (rd->data == 0xd6) {
    if ((J->base[1] & 0x1f000000) != 0x4000000) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    TVar1 = J->base[1];
    TVar2 = lj_ir_kgc(J,(GCobj *)(rd->argv[1].u64 & 0x7fffffffffff),IRT_STR);
    (J->fold).ins.field_0.ot = 0x884;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    lj_opt_fold(J);
    rd->nres = 3;
  }
  J->postproc = LJ_POST_FIXCONST;
  J->base[2] = 0x7fff;
  J->base[1] = 0x7fff;
  *J->base = 0x7fff;
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_xof(jit_State *J, RecordFFData *rd)
{
  CTypeID id = argv2ctype(J, J->base[0], &rd->argv[0]);
  if (rd->data == FF_ffi_sizeof) {
    CType *ct = lj_ctype_rawref(ctype_ctsG(J2G(J)), id);
    if (ctype_isvltype(ct->info))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
  } else if (rd->data == FF_ffi_offsetof) {  /* Specialize to the field name. */
    if (!tref_isstr(J->base[1]))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    emitir(IRTG(IR_EQ, IRT_STR), J->base[1], lj_ir_kstr(J, strV(&rd->argv[1])));
    rd->nres = 3;  /* Just in case. */
  }
  J->postproc = LJ_POST_FIXCONST;
  J->base[0] = J->base[1] = J->base[2] = TREF_NIL;
}